

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rs_internal.h
# Opt level: O3

uint * shift_msg_to_vec(uchar *msg,uint len,uint t,uint *new_len)

{
  uint uVar1;
  uint *puVar2;
  ulong uVar3;
  
  uVar1 = len + t * 2;
  if (new_len != (uint *)0x0) {
    *new_len = uVar1;
  }
  puVar2 = (uint *)calloc((ulong)uVar1,4);
  if (len != 0) {
    uVar3 = 0;
    do {
      puVar2[t * 2 + uVar3] = (uint)msg[uVar3];
      uVar3 = uVar3 + 1;
    } while (len != uVar3);
  }
  return puVar2;
}

Assistant:

uint32_t *shift_msg_to_vec(uint8_t *msg, uint32_t len, uint32_t t, uint32_t *new_len)
{
    uint32_t v_len = 2 * t + len;

    if (new_len != NULL)
        *new_len = v_len;

    uint32_t *v = vector_new(v_len);
    for (uint32_t i = 0; i < len; i++)
        *(v + 2 * t + i) = msg[i];

    return v;
}